

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PushFunctionScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  cmCommandContext *entryPointCommand;
  _Elt_pointer piVar1;
  bool bVar2;
  Snapshot local_38;
  
  entryPointCommand =
       (this->ContextStack).
       super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1];
  cmState::CreateFunctionCallSnapshot
            (&local_38,this->GlobalGenerator->CMakeInstance->State,this->StateSnapshot,
             &entryPointCommand->Name,entryPointCommand->Line,fileName);
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  (this->StateSnapshot).State = (cmState *)CONCAT44(local_38.State._4_4_,local_38.State._0_4_);
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar2 = cmState::Snapshot::IsValid(&this->StateSnapshot);
  if (bVar2) {
    local_38.State._0_4_ = 0;
    piVar1 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar1 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
                (&(this->LoopBlockCounter).c,(int *)&local_38);
    }
    else {
      *piVar1 = 0;
      (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = piVar1 + 1;
    }
    cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
    PushFunctionBlockerBarrier(this);
    cmState::Snapshot::PushPolicy
              (&this->StateSnapshot,*(PolicyMap *)(pm->Status).super__Base_bitset<4UL>._M_w,true);
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x603,
                "void cmMakefile::PushFunctionScope(const std::string &, const cmPolicies::PolicyMap &)"
               );
}

Assistant:

void cmMakefile::PushFunctionScope(std::string const& fileName,
                                   const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot =
      this->GetState()->CreateFunctionCallSnapshot(
        this->StateSnapshot,
        this->ContextStack.back()->Name, this->ContextStack.back()->Line,
        fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}